

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integer_to_hex.hpp
# Opt level: O0

char * mserialize::detail::write_integer_as_hex<unsigned_long>(unsigned_long v,char *end)

{
  char digits [17];
  char *end_local;
  unsigned_long v_local;
  
  builtin_strncpy(digits,"0123456789ABCDEF",0x11);
  if (v == 0) {
    end_local = end + -1;
    end[-1] = '0';
  }
  else {
    end_local = end;
    v_local = v;
    if (v == 0) {
      end_local = end + -1;
      end[-1] = '-';
    }
    else {
      for (; v_local != 0; v_local = v_local >> 4) {
        end_local[-1] = digits[v_local & 0xf];
        end_local = end_local + -1;
      }
    }
  }
  return end_local;
}

Assistant:

constexpr char* write_integer_as_hex(Integer v, char* end)
{
  const char digits[] = "0123456789ABCDEF";

  if (v == 0)
  {
    *--end = '0';
  }
  else if (v > 0)
  {
    while (v != 0)
    {
      *--end = digits[v % 16];
      v = static_cast<Integer>(v / 16);
    }
  }
  else
  {
    while (v != 0)
    {
      *--end = digits[-(v % 16)];
      v = static_cast<Integer>(v / 16);
    }
    *--end = '-';
  }

  return end;
}